

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

int netaddr_create_host_bin(netaddr *host,netaddr *netmask,void *number,size_t num_length)

{
  uint8_t uVar1;
  byte bVar2;
  long lVar3;
  uint8_t mask;
  uint8_t *number_byte;
  long lStack_48;
  uint8_t host_part_length;
  size_t number_index;
  size_t host_index;
  size_t num_length_local;
  void *number_local;
  netaddr *netmask_local;
  netaddr *host_local;
  
  *(undefined8 *)host->_addr = *(undefined8 *)netmask->_addr;
  *(undefined8 *)(host->_addr + 8) = *(undefined8 *)(netmask->_addr + 8);
  uVar1 = netmask->_prefix_len;
  host->_type = netmask->_type;
  host->_prefix_len = uVar1;
  uVar1 = netaddr_get_af_maxprefix((uint)host->_type);
  host->_prefix_len = uVar1;
  if (host->_prefix_len == '\0') {
    host_local._4_4_ = -1;
  }
  else if ((host->_prefix_len == netmask->_prefix_len) || (num_length == 0)) {
    host_local._4_4_ = 0;
  }
  else {
    bVar2 = (byte)((int)(((uint)host->_prefix_len - (uint)netmask->_prefix_len) + 7) / 8);
    if (num_length < bVar2) {
      number_index = (long)(int)(host->_prefix_len / 8) - num_length;
      lStack_48 = 0;
    }
    else {
      number_index = (size_t)(int)(netmask->_prefix_len / 8);
      lVar3 = num_length - bVar2;
      lStack_48 = lVar3;
      if ((netmask->_prefix_len & 7) != 0) {
        bVar2 = (byte)(0xff >> (netmask->_prefix_len & 7));
        host->_addr[number_index] = host->_addr[number_index] & (bVar2 ^ 0xff);
        lStack_48 = lVar3 + 1;
        host->_addr[number_index] =
             host->_addr[number_index] | *(byte *)((long)number + lVar3) & bVar2;
        number_index = number_index + 1;
      }
    }
    memcpy(host->_addr + number_index,(void *)((long)number + lStack_48),num_length - lStack_48);
    host_local._4_4_ = 0;
  }
  return host_local._4_4_;
}

Assistant:

int
netaddr_create_host_bin(struct netaddr *host, const struct netaddr *netmask, const void *number, size_t num_length) {
  size_t host_index, number_index;
  uint8_t host_part_length;
  const uint8_t *number_byte;
  uint8_t mask;

  number_byte = number;

  /* copy netmask with prefixlength max */
  memcpy(host, netmask, sizeof(*netmask));
  host->_prefix_len = netaddr_get_maxprefix(host);

  /* unknown address type */
  if (host->_prefix_len == 0) {
    return -1;
  }

  /* netmask has no host part */
  if (host->_prefix_len == netmask->_prefix_len || num_length == 0) {
    return 0;
  }

  /* calculate starting byte in host and number */
  host_part_length = (host->_prefix_len - netmask->_prefix_len + 7) / 8;
  if (host_part_length > num_length) {
    host_index = host->_prefix_len / 8 - num_length;
    number_index = 0;
  }
  else {
    host_index = netmask->_prefix_len / 8;
    number_index = num_length - host_part_length;

    /* copy bit masked part */
    if ((netmask->_prefix_len & 7) != 0) {
      mask = (255 >> (netmask->_prefix_len & 7));
      host->_addr[host_index] &= (~mask);
      host->_addr[host_index] |= (number_byte[number_index++]) & mask;
      host_index++;
    }
  }

  /* copy bytes */
  memcpy(&host->_addr[host_index], &number_byte[number_index], num_length - number_index);
  return 0;
}